

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O3

bool basisu::uastc_rdo_blocks
               (uint32_t first_index,uint32_t last_index,uastc_block *pBlocks,
               color_rgba *pBlock_pixels,uastc_rdo_params *params,uint32_t flags,
               uint32_t *total_skipped,uint32_t *total_refined,uint32_t *total_modified,
               uint32_t *total_smooth)

{
  byte bVar1;
  color_rgba *pcVar2;
  bool bVar3;
  uint32_t i;
  uint uVar4;
  _Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false> _Var6;
  uint uVar5;
  long lVar7;
  long lVar8;
  iterator iVar9;
  undefined8 uVar10;
  sbyte sVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  undefined8 extraout_RDX;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  int *piVar21;
  unpacked_uastc_block *puVar22;
  long lVar23;
  astc_block_desc *paVar24;
  ulong uVar25;
  byte bVar26;
  uint32_t mul_search_rad;
  long lVar27;
  anon_union_4_3_898e29d3_for_color32_0 *paVar29;
  uint32_t table_mask;
  long lVar30;
  ulong uVar31;
  long lVar32;
  long lVar33;
  uint32_t base_search_rad;
  uint64_t bits_1;
  ulong uVar34;
  uint32_t num_pixels;
  uastc_block *blk;
  ulong uVar35;
  byte bVar36;
  float fVar37;
  float fVar38;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar41 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar42 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 auVar43 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 auVar44 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  anon_union_16_2_e7f8845d_for_uastc_block_0 aVar48;
  pair<std::__detail::_Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>,_bool>
  pVar49;
  uastc_block best_block;
  bc7_block trial_b7_block;
  unpacked_uastc_block unpacked_prev_blk;
  color_rgba decoded_trial_b7_blk [4] [4];
  color_rgba decoded_trial_uastc_block [4] [4];
  unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
  selector_history;
  bc7_optimization_results trial_b7_results;
  bc7_block b7_block;
  unpacked_uastc_block unpacked_trial_blk;
  color_rgba decoded_b7_blk [4] [4];
  color_rgba decoded_uastc_block [4] [4];
  unpacked_uastc_block unpacked_blk;
  bc7_optimization_results b7_results;
  bool local_53a;
  bool local_539;
  ulong local_538;
  float local_52c;
  anon_union_16_2_e7f8845d_for_uastc_block_0 local_528;
  ulong local_510;
  uastc_rdo_params *local_508;
  float local_4fc;
  undefined8 local_4f8;
  uint local_4ec;
  float local_4e8;
  uint local_4e4;
  float local_4e0;
  float local_4dc;
  anon_union_16_2_e7f8845d_for_uastc_block_0 *local_4d8;
  ulong local_4d0;
  color_rgba *local_4c8;
  color_rgba *local_4c0;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false> local_4b8;
  uint32_t local_4b0;
  float local_4ac;
  uint32_t local_4a8;
  int local_4a4;
  float local_4a0;
  uint32_t local_49c;
  anon_union_16_2_e7f8845d_for_uastc_block_0 local_498;
  ulong local_480;
  ulong local_478;
  ulong local_470;
  uastc_block *local_468;
  eac_a8_block local_460 [2];
  ulong local_450;
  uint8_t *local_448;
  ulong local_440;
  ulong local_438;
  unpacked_uastc_block local_430;
  anon_union_8_2_04352b30_for_etc_block_0 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  anon_union_4_3_898e29d3_for_color32_0 local_358 [18];
  _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_310;
  uastc_encode_results local_2d8;
  undefined1 local_250 [8];
  uint8_t auStack_248 [8];
  unpacked_uastc_block local_240;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_1a8 [16];
  anon_union_4_3_898e29d3_for_color32_0 local_168 [16];
  unpacked_uastc_block local_128;
  bc7_optimization_results local_90;
  ulong uVar28;
  
  bVar36 = 0;
  local_468 = pBlocks;
  debug_printf("uastc_rdo_blocks: Processing blocks %u to %u\n",(ulong)first_index,(ulong)last_index
              );
  uVar4 = params->m_lz_dict_size >> 4;
  local_4a4 = uVar4 + (uVar4 == 0);
  local_310._M_buckets = &local_310._M_single_bucket;
  local_310._M_bucket_count = 1;
  local_310._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_310._M_element_count = 0;
  local_310._M_rehash_policy._M_max_load_factor = 1.0;
  local_310._M_rehash_policy._M_next_resize = 0;
  local_310._M_single_bucket = (__node_base_ptr)0x0;
  local_508 = params;
  if (first_index < last_index) {
    local_4ec = flags & 0xf;
    uVar35 = (ulong)first_index;
    local_448 = (pBlock_pixels->field_0).m_comps + 3;
    local_470 = uVar35 << 4;
    uVar10 = 0;
    local_4c0 = pBlock_pixels;
    local_4b0 = flags;
    local_4a8 = first_index;
    local_438 = (ulong)last_index;
    do {
      local_4d8 = &local_468[uVar35].field_0;
      local_4f8 = uVar10;
      bVar3 = basist::unpack_uastc((uastc_block *)local_4d8,&local_128,false,true);
      pcVar2 = local_4c0;
      if (!bVar3) goto LAB_00259d1c;
      _Var6.
      super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>.
      _M_cur._4_4_ = 0;
      _Var6.
      super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>.
      _M_cur._0_4_ = local_128.m_mode;
      pVar49._8_8_ = extraout_RDX;
      pVar49.first.
      super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>.
      _M_cur = _Var6.
               super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
               ._M_cur;
      if (_Var6.
          super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
          ._M_cur != (__node_type *)0x8) {
        uVar25 = local_470 >> 4 & 0xfffffff;
        lVar32 = uVar25 * 0x40;
        local_4c8 = pBlock_pixels + (uint)((int)uVar35 << 4);
        lVar8 = 0;
        lVar33 = 0;
        lVar30 = 0;
        lVar27 = 0;
        lVar23 = 0;
        lVar19 = 0;
        lVar17 = 0;
        lVar15 = 0;
        lVar7 = 0;
        do {
          bVar26 = local_448[lVar8 * 4 + lVar32 + -3];
          lVar33 = lVar33 + (ulong)bVar26;
          lVar30 = lVar30 + (ulong)((uint)bVar26 * (uint)bVar26);
          bVar26 = local_448[lVar8 * 4 + lVar32 + -2];
          lVar27 = lVar27 + (ulong)bVar26;
          lVar23 = lVar23 + (ulong)((uint)bVar26 * (uint)bVar26);
          bVar26 = local_448[lVar8 * 4 + lVar32 + -1];
          bVar1 = local_448[lVar8 * 4 + lVar32];
          lVar8 = lVar8 + 1;
          lVar19 = lVar19 + (ulong)bVar26;
          lVar17 = lVar17 + (ulong)((uint)bVar26 * (uint)bVar26);
          lVar15 = lVar15 + (ulong)bVar1;
          lVar7 = lVar7 + (ulong)((uint)bVar1 * (uint)bVar1);
        } while (lVar8 != 0x10);
        fVar37 = SQRT((float)(ulong)(lVar30 * 0x10 - lVar33 * lVar33)) * 0.0625;
        fVar46 = SQRT((float)(ulong)(lVar23 * 0x10 - lVar27 * lVar27)) * 0.0625;
        if (fVar37 <= fVar46) {
          fVar37 = fVar46;
        }
        fVar46 = SQRT((float)(ulong)(lVar17 * 0x10 - lVar19 * lVar19)) * 0.0625;
        if (fVar37 <= fVar46) {
          fVar37 = fVar46;
        }
        fVar46 = SQRT((float)(ulong)(lVar7 * 0x10 - lVar15 * lVar15)) * 0.0625;
        if (fVar37 <= fVar46) {
          fVar37 = fVar46;
        }
        fVar37 = fVar37 / local_508->m_max_smooth_block_std_dev;
        fVar46 = 1.0;
        if (fVar37 <= 1.0) {
          fVar46 = fVar37;
        }
        fVar46 = (float)(~-(uint)(fVar37 < 0.0) & (uint)fVar46);
        local_4e0 = local_508->m_smooth_block_max_error_scale;
        aVar48 = (anon_union_16_2_e7f8845d_for_uastc_block_0)ZEXT416((uint)local_4e0);
        local_4e0 = (1.0 - local_4e0) * fVar46 * fVar46 + local_4e0;
        if (1.0 < local_4e0) {
          *total_smooth = *total_smooth + 1;
        }
        local_510 = uVar35;
        local_4b8 = _Var6.
                    super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                    ._M_cur;
        bVar3 = basist::unpack_uastc(&local_128,(color32 *)&local_168[0].field_0,false);
        if (!bVar3) {
LAB_00259d1c:
          bVar36 = (byte)local_4f8;
          goto LAB_00259d21;
        }
        lVar8 = 0;
        lVar7 = 0;
        auVar39 = extraout_XMM0;
        do {
          auVar39 = pmovzxbd(auVar39,pBlock_pixels[uVar25 * 0x10 + lVar8].field_0);
          aVar48.m_bytes = (uint8_t  [16])pmovzxbd(aVar48.m_bytes,local_168[lVar8].m);
          auVar40._0_4_ = auVar39._0_4_ - aVar48.m_dwords[0];
          auVar40._4_4_ = auVar39._4_4_ - aVar48.m_dwords[1];
          auVar40._8_4_ = auVar39._8_4_ - aVar48.m_dwords[2];
          auVar40._12_4_ = auVar39._12_4_ - aVar48.m_dwords[3];
          auVar39 = pmulld(auVar40,auVar40);
          auVar39 = phaddd(auVar39,auVar39);
          auVar39 = phaddd(auVar39,auVar39);
          lVar7 = lVar7 + (ulong)auVar39._0_4_;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x10);
        bVar3 = basist::transcode_uastc_to_bc7(&local_128,&local_90);
        if (!bVar3) goto LAB_00259d1c;
        basist::encode_bc7_block(local_250,&local_90);
        unpack_block(cBC7,local_250,(color_rgba *)&local_1a8[0].field_1);
        lVar15 = 0;
        lVar8 = 0;
        auVar39 = extraout_XMM0_00;
        do {
          auVar39 = pmovzxbd(auVar39,pBlock_pixels[uVar25 * 0x10 + lVar15].field_0);
          aVar48.m_bytes = (uint8_t  [16])pmovzxbd(aVar48.m_bytes,local_1a8[lVar15]);
          auVar41._0_4_ = auVar39._0_4_ - aVar48.m_dwords[0];
          auVar41._4_4_ = auVar39._4_4_ - aVar48.m_dwords[1];
          auVar41._8_4_ = auVar39._8_4_ - aVar48.m_dwords[2];
          auVar41._12_4_ = auVar39._12_4_ - aVar48.m_dwords[3];
          auVar39 = pmulld(auVar41,auVar41);
          auVar39 = phaddd(auVar39,auVar39);
          auVar39 = phaddd(auVar39,auVar39);
          lVar8 = lVar8 + (ulong)auVar39._0_4_;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x10);
        local_52c = (float)((ulong)(lVar8 + lVar7) >> 1) * 0.015625;
        if (local_52c < 0.0) {
          fVar37 = sqrtf(local_52c);
        }
        else {
          fVar37 = SQRT(local_52c);
        }
        uVar35 = local_510;
        bVar26 = g_uastc_mode_selector_bits[(long)local_4b8._M_cur * 2];
        local_538 = (ulong)bVar26;
        bVar1 = g_uastc_mode_selector_bits[(long)local_4b8._M_cur * 2 + 1];
        if (0x80 < (uint)bVar1 + (uint)bVar26) {
          __assert_fail("first_sel_bit + total_sel_bits <= 128",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                        ,0xf53,
                        "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                       );
        }
        if (bVar1 == 0) {
          __assert_fail("total_sel_bits > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                        ,0xf54,
                        "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                       );
        }
        uVar4 = 0x40;
        if (bVar1 < 0x40) {
          uVar4 = (uint)bVar1;
        }
        local_430.m_astc._0_8_ = 0;
        uVar5 = 0;
        uVar34 = local_538;
        do {
          uVar12 = (uint)uVar34 & 7;
          iVar16 = 8 - uVar12;
          if ((int)(uVar4 - uVar5) < iVar16) {
            iVar16 = uVar4 - uVar5;
          }
          uVar12 = (uint)(local_4d8->m_bytes[uVar34 >> 3] >> (sbyte)uVar12);
          uVar28 = (ulong)uVar12;
          uVar31 = (ulong)(~(-1 << ((byte)iVar16 & 0x1f)) & uVar12) << ((byte)uVar5 & 0x3f);
          local_430.m_astc._0_8_ = local_430.m_astc._0_8_ | uVar31;
          uVar5 = uVar5 + iVar16;
          uVar34 = (ulong)((uint)uVar34 + iVar16);
        } while (uVar5 < uVar4);
        local_4d0 = (ulong)bVar1;
        if (local_508->m_skip_block_rms_thresh <= fVar37) {
          local_430.m_astc.m_partition_seed = (int)bVar26;
          iVar16 = (int)local_510;
          local_430.m_astc.m_ccs = iVar16;
          pVar49 = std::
                   _Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   ::_M_emplace<std::pair<basisu::selector_bitsequence,unsigned_int>>
                             ((_Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                               *)&local_310,&local_430);
          if (((undefined1  [16])pVar49 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            *(int *)((long)pVar49.first.
                           super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                           ._M_cur.
                           super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                    + 0x18) = iVar16;
          }
          pVar49._8_8_ = pVar49._8_8_;
          pVar49.first.
          super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
          ._M_cur = (_Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                     )(_Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                       )total_skipped;
          *total_skipped = *total_skipped + 1;
          pBlock_pixels = pcVar2;
          goto LAB_00259cfb;
        }
        local_430.m_astc.m_partition_seed = (int)bVar26;
        local_4a0 = fVar37;
        iVar9 = std::
                _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&local_310,(key_type *)&local_430);
        table_mask = (uint32_t)uVar31;
        mul_search_rad = (uint32_t)uVar28;
        local_4fc = (float)local_510;
        if (iVar9.
            super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
            ._M_cur == (__node_type *)0x0) {
          uVar5 = (local_508->m_lz_literal_cost * (int)local_4d0) / 100;
        }
        else {
          uVar5 = ((int)local_4fc -
                  *(int *)((long)iVar9.
                                 super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                                 ._M_cur + 0x18)) * 0x10;
          if (uVar5 < 0x200) {
            iVar16 = (byte)g_tdefl_small_dist_extra[uVar5] + 5;
          }
          else {
            uVar12 = 0x7fff;
            if (uVar5 < 0x7fff) {
              uVar12 = uVar5;
            }
            iVar16 = (byte)g_tdefl_large_dist_extra[uVar12 >> 8] + 5;
            if (0x7fff < uVar5) {
              do {
                iVar16 = iVar16 + 1;
                bVar3 = 0xffff < uVar5;
                uVar5 = uVar5 >> 1;
              } while (bVar3);
            }
          }
          uVar5 = iVar16 + 7;
        }
        local_49c = (int)local_4fc - local_4a4;
        if ((int)local_4fc - local_4a4 < (int)local_4a8) {
          local_49c = local_4a8;
        }
        local_498.m_bytes = *(uint8_t (*) [16])local_4d8;
        fVar37 = (float)((int)local_4fc + -1);
        if ((int)local_49c <= (int)fVar37) {
          aVar48 = (anon_union_16_2_e7f8845d_for_uastc_block_0)
                   ZEXT416((uint)(local_52c * local_4e0));
          local_440 = 1L << ((byte)uVar4 & 0x3f);
          local_478 = local_440 - 1;
          if (0x3f < (byte)local_4d0) {
            local_478 = 0xffffffffffffffff;
          }
          local_450 = 1L << ((byte)local_4d0 & 0x3f);
          local_4e8 = (float)(int)uVar5 * local_508->m_lambda + local_52c * local_4e0;
          uVar5 = (int)local_4d0 - 0x40;
          local_4e4 = (int)local_538 + uVar4;
          local_480 = local_450 - 1;
          if (uVar5 == 0x40) {
            local_480 = 0xffffffffffffffff;
          }
          do {
            blk = local_468 + (int)fVar37;
            uVar34 = 0;
            uVar12 = 0;
            uVar35 = local_538 & 0xffffffff;
            do {
              uVar13 = (uint)uVar35 & 7;
              iVar16 = 8 - uVar13;
              if ((int)(uVar4 - uVar12) < iVar16) {
                iVar16 = uVar4 - uVar12;
              }
              uVar34 = uVar34 | (ulong)(~(-1 << ((byte)iVar16 & 0x1f)) &
                                       (uint)((blk->field_0).m_bytes[uVar35 >> 3] >> (sbyte)uVar13))
                                << ((byte)uVar12 & 0x3f);
              uVar12 = uVar12 + iVar16;
              uVar35 = (ulong)(iVar16 + (uint)uVar35);
            } while (uVar12 < uVar4);
            local_430.m_astc.m_partition_seed = (int)local_538;
            local_52c = fVar37;
            local_430.m_astc._0_8_ = uVar34;
            iVar9 = std::
                    _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&local_310,(key_type *)&local_430);
            fVar46 = local_52c;
            if ((iVar9.
                 super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                 ._M_cur == (__node_type *)0x0) ||
               (fVar46 = *(float *)((long)iVar9.
                                          super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                                          ._M_cur + 0x18), fVar37 = local_52c,
               (int)fVar46 <= (int)local_52c)) {
              local_4dc = fVar46;
              bVar3 = basist::unpack_uastc(blk,&local_430,false,true);
              fVar37 = local_52c;
              if (!bVar3) goto LAB_00259d1c;
              local_528.m_dwords[0] = (uint32_t)*(undefined8 *)local_4d8;
              local_528.m_dwords[1] = (uint32_t)((ulong)*(undefined8 *)local_4d8 >> 0x20);
              local_528.m_dwords[2] = (uint32_t)*(undefined8 *)(local_4d8->m_bytes + 8);
              local_528.m_dwords[3] =
                   (uint32_t)((ulong)*(undefined8 *)(local_4d8->m_bytes + 8) >> 0x20);
              uVar18 = local_478;
              uVar12 = uVar4;
              if ((byte)local_4d0 < 0x40) {
                uVar20 = local_538 & 0xffffffff;
                if (local_440 <= uVar34) goto LAB_00259d45;
              }
              else {
                uVar20 = local_538 & 0xffffffff;
              }
              do {
                uVar14 = (uint)uVar20 & 7;
                uVar13 = 8 - uVar14;
                if (uVar12 <= uVar13) {
                  uVar13 = uVar12;
                }
                sVar11 = (sbyte)uVar14;
                lVar8 = uVar18 << sVar11;
                uVar31 = uVar20 >> 3;
                bVar26 = ~(byte)lVar8 & local_528.m_bytes[uVar31];
                uVar28 = CONCAT71((int7)((ulong)lVar8 >> 8),bVar26);
                lVar8 = uVar34 << sVar11;
                uVar34 = uVar34 >> ((byte)uVar13 & 0x3f);
                local_528.m_bytes[uVar31] = (byte)lVar8 | bVar26;
                uVar20 = (ulong)((uint)uVar20 + uVar13);
                uVar12 = uVar12 - uVar13;
                uVar18 = uVar18 >> ((byte)uVar13 & 0x3f);
              } while (uVar12 != 0);
              if (0x40 < (byte)local_4d0) {
                if (0x40 < uVar5) {
                  __assert_fail("codesize <= 64",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                                ,0x5a,
                                "uint64_t basisu::read_bits(const uint8_t *, uint32_t &, uint32_t)")
                  ;
                }
                if (uVar5 != 0) {
                  uVar34 = 0;
                  uVar12 = 0;
                  do {
                    uVar13 = (uint)uVar35 & 7;
                    iVar16 = 8 - uVar13;
                    if ((int)(uVar5 - uVar12) < iVar16) {
                      iVar16 = uVar5 - uVar12;
                    }
                    uVar34 = uVar34 | (ulong)(~(-1 << ((byte)iVar16 & 0x1f)) &
                                             (uint)((blk->field_0).m_bytes[uVar35 >> 3] >>
                                                   (sbyte)uVar13)) << ((byte)uVar12 & 0x3f);
                    uVar12 = uVar12 + iVar16;
                    uVar35 = (ulong)((uint)uVar35 + iVar16);
                  } while (uVar12 < uVar5);
                  uVar35 = local_480;
                  uVar12 = local_4e4;
                  if (uVar5 == 0x40) {
                    uVar28 = 0x40;
                  }
                  else {
                    uVar28 = (ulong)uVar5;
                    if (local_450 <= uVar34) {
LAB_00259d45:
                      __assert_fail("(num_bits == 64) || (val < (1ULL << num_bits))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                                    ,0xea0,
                                    "uint32_t basisu::set_block_bits(uint8_t *, uint64_t, uint32_t, uint32_t)"
                                   );
                    }
                  }
                  do {
                    uVar13 = 8 - (uVar12 & 7);
                    uVar14 = (uint)uVar28;
                    if (uVar14 <= uVar13) {
                      uVar13 = uVar14;
                    }
                    sVar11 = (sbyte)(uVar12 & 7);
                    lVar8 = uVar35 << sVar11;
                    bVar26 = ~(byte)lVar8 & local_528.m_bytes[uVar12 >> 3];
                    uVar31 = CONCAT71((int7)((ulong)lVar8 >> 8),bVar26);
                    lVar8 = uVar34 << sVar11;
                    uVar34 = uVar34 >> ((byte)uVar13 & 0x3f);
                    local_528.m_bytes[uVar12 >> 3] = (byte)lVar8 | bVar26;
                    uVar28 = (ulong)(uVar14 - uVar13);
                    uVar35 = uVar35 >> ((byte)uVar13 & 0x3f);
                    uVar12 = uVar12 + uVar13;
                  } while (uVar14 - uVar13 != 0);
                }
              }
              bVar3 = basist::unpack_uastc((uastc_block *)&local_528,&local_240,false,true);
              if ((bVar3) &&
                 (bVar3 = basist::unpack_uastc(&local_240,(color32 *)&local_358[0].field_0,false),
                 bVar3)) {
                lVar8 = 0;
                lVar7 = 0;
                auVar39 = extraout_XMM0_01;
                do {
                  auVar39 = pmovzxbd(auVar39,pBlock_pixels[uVar25 * 0x10 + lVar8].field_0);
                  aVar48.m_bytes = (uint8_t  [16])pmovzxbd(aVar48.m_bytes,local_358[lVar8].m);
                  auVar42._0_4_ = auVar39._0_4_ - aVar48.m_dwords[0];
                  auVar42._4_4_ = auVar39._4_4_ - aVar48.m_dwords[1];
                  auVar42._8_4_ = auVar39._8_4_ - aVar48.m_dwords[2];
                  auVar42._12_4_ = auVar39._12_4_ - aVar48.m_dwords[3];
                  auVar39 = pmulld(auVar42,auVar42);
                  auVar39 = phaddd(auVar39,auVar39);
                  auVar39 = phaddd(auVar39,auVar39);
                  lVar7 = lVar7 + (ulong)auVar39._0_4_;
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 0x10);
                bVar3 = basist::transcode_uastc_to_bc7
                                  (&local_240,(bc7_optimization_results *)&local_2d8);
                if (!bVar3) goto LAB_00259d1c;
                basist::encode_bc7_block(local_460,(bc7_optimization_results *)&local_2d8);
                unpack_block(cBC7,local_460,(color_rgba *)&local_398);
                lVar15 = 0;
                lVar8 = 0;
                auVar39 = extraout_XMM0_02;
                do {
                  auVar39 = pmovzxbd(auVar39,pBlock_pixels[uVar25 * 0x10 + lVar15].field_0);
                  aVar48.m_bytes =
                       (uint8_t  [16])
                       pmovzxbd(aVar48.m_bytes,*(undefined4 *)((long)&local_398 + lVar15 * 4));
                  auVar43._0_4_ = auVar39._0_4_ - aVar48.m_dwords[0];
                  auVar43._4_4_ = auVar39._4_4_ - aVar48.m_dwords[1];
                  auVar43._8_4_ = auVar39._8_4_ - aVar48.m_dwords[2];
                  auVar43._12_4_ = auVar39._12_4_ - aVar48.m_dwords[3];
                  auVar39 = pmulld(auVar43,auVar43);
                  auVar39 = phaddd(auVar39,auVar39);
                  auVar39 = phaddd(auVar39,auVar39);
                  lVar8 = lVar8 + (ulong)auVar39._0_4_;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0x10);
                fVar46 = (float)((ulong)(lVar8 + lVar7) >> 1) * 0.015625;
                if (fVar46 < 0.0) {
                  local_4ac = fVar46;
                  fVar38 = sqrtf(fVar46);
                  fVar46 = local_4ac;
                }
                else {
                  fVar38 = SQRT(fVar46);
                }
                fVar47 = local_508->m_max_allowed_rms_increase_ratio * local_4a0;
                aVar48 = (anon_union_16_2_e7f8845d_for_uastc_block_0)ZEXT416((uint)fVar47);
                if (fVar38 <= fVar47) {
                  uVar12 = ((int)local_510 - (int)local_4dc) * 0x10;
                  if (uVar12 < 0x200) {
                    iVar16 = (byte)g_tdefl_small_dist_extra[uVar12] + 5;
                  }
                  else {
                    uVar13 = 0x7fff;
                    if (uVar12 < 0x7fff) {
                      uVar13 = uVar12;
                    }
                    iVar16 = (byte)g_tdefl_large_dist_extra[uVar13 >> 8] + 5;
                    if (0x7fff < uVar12) {
                      uVar35 = (ulong)uVar12;
                      do {
                        iVar16 = iVar16 + 1;
                        uVar12 = (uint)uVar35;
                        uVar35 = uVar35 >> 1;
                      } while (0xffff < uVar12);
                    }
                  }
                  fVar46 = (float)(iVar16 + 7) * local_508->m_lambda + fVar46 * local_4e0;
                  aVar48 = (anon_union_16_2_e7f8845d_for_uastc_block_0)ZEXT416((uint)local_4e8);
                  if (fVar46 < local_4e8) {
                    aVar48.m_dwords[1] = local_528.m_dwords[1];
                    aVar48.m_dwords[0] = local_528.m_dwords[0];
                    aVar48.m_dwords[2] = local_528.m_dwords[2];
                    aVar48.m_dwords[3] = local_528.m_dwords[3];
                    local_498 = aVar48;
                    local_4e8 = fVar46;
                    local_4fc = fVar37;
                  }
                }
              }
            }
            table_mask = (uint32_t)uVar31;
            mul_search_rad = (uint32_t)uVar28;
            fVar37 = (float)((int)fVar37 + -1);
          } while ((int)local_49c <= (int)fVar37);
        }
        pcVar2 = local_4c0;
        if (local_510 != (uint)local_4fc) {
          *total_modified = *total_modified + 1;
          bVar3 = basist::unpack_uastc((uastc_block *)&local_498,&local_240,false,false);
          if (!bVar3) goto LAB_00259d1c;
          if ((local_4b8._M_cur == (__node_type *)0x0) &&
             (local_508->m_endpoint_refinement != false)) {
            bVar3 = basist::unpack_uastc(&local_240,(color32 *)&local_2d8,false);
            if (!bVar3) goto LAB_00259d1c;
            lVar8 = 0;
            uVar35 = 0;
            auVar39 = extraout_XMM0_03;
            do {
              auVar39 = pmovzxbd(auVar39,pBlock_pixels[uVar25 * 0x10 + lVar8].field_0);
              aVar48.m_bytes =
                   (uint8_t  [16])
                   pmovzxbd(aVar48.m_bytes,
                            *(undefined4 *)(local_2d8.m_astc.m_endpoints + lVar8 * 4 + -0x1d));
              auVar44._0_4_ = auVar39._0_4_ - aVar48.m_dwords[0];
              auVar44._4_4_ = auVar39._4_4_ - aVar48.m_dwords[1];
              auVar44._8_4_ = auVar39._8_4_ - aVar48.m_dwords[2];
              auVar44._12_4_ = auVar39._12_4_ - aVar48.m_dwords[3];
              auVar39 = pmulld(auVar44,auVar44);
              auVar39 = phaddd(auVar39,auVar39);
              auVar39 = phaddd(auVar39,auVar39);
              uVar35 = uVar35 + auVar39._0_4_;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x10);
            local_398.m_uint64 = 0x100000040;
            uStack_390 = 0x100000001;
            local_388 = 1;
            uStack_380 = 0x100000000;
            local_528.m_dwords[0] = 0;
            astc_mode0_or_18(0,(color_rgba (*) [4])local_4c8,(uastc_encode_results *)&local_430,
                             (uint32_t *)local_528.m_bytes,
                             (bc7enc_compress_block_params *)&local_398,local_240.m_astc.m_weights);
            if (local_528.m_dwords[0] != 1) {
              __assert_fail("total_results == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                            ,0xff0,
                            "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                           );
            }
            local_460[0]._0_4_ = local_430.m_solid_color.field_0;
            paVar29 = local_358;
            table_mask = 0;
            bVar3 = basist::unpack_uastc
                              (local_430.m_astc.m_weight_range,local_430.m_astc.m_subsets,
                               (color32 *)local_460,
                               (astc_block_desc *)&local_430.m_astc.m_partition_seed,
                               (color32 *)&paVar29->field_0,false);
            mul_search_rad = (uint32_t)paVar29;
            if (!bVar3) {
              __assert_fail("success",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                            ,0xff6,
                            "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                           );
            }
            lVar8 = 0;
            uVar34 = 0;
            auVar39 = extraout_XMM0_04;
            do {
              auVar39 = pmovzxbd(auVar39,pBlock_pixels[uVar25 * 0x10 + lVar8].field_0);
              aVar48.m_bytes = (uint8_t  [16])pmovzxbd(aVar48.m_bytes,local_358[lVar8].m);
              auVar45._0_4_ = auVar39._0_4_ - aVar48.m_dwords[0];
              auVar45._4_4_ = auVar39._4_4_ - aVar48.m_dwords[1];
              auVar45._8_4_ = auVar39._8_4_ - aVar48.m_dwords[2];
              auVar45._12_4_ = auVar39._12_4_ - aVar48.m_dwords[3];
              auVar39 = pmulld(auVar45,auVar45);
              auVar39 = phaddd(auVar39,auVar39);
              auVar39 = phaddd(auVar39,auVar39);
              uVar34 = uVar34 + auVar39._0_4_;
              lVar8 = lVar8 + 1;
            } while (lVar8 != 0x10);
            if (uVar34 < uVar35) {
              lVar8 = 0x2f;
              do {
                if (auStack_248[lVar8] != local_430.m_astc.m_endpoints[lVar8 + -0x15]) {
                  __assert_fail("unpacked_best_blk.m_astc.m_weights[i] == results.m_astc.m_weights[i]"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                                ,0x1004,
                                "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                               );
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 != 0x3f);
              piVar21 = &local_430.m_astc.m_partition_seed;
              puVar22 = &local_240;
              for (lVar8 = 0x1a; lVar8 != 0; lVar8 = lVar8 + -1) {
                (puVar22->m_astc).m_weight_range = *piVar21;
                piVar21 = piVar21 + (ulong)bVar36 * -2 + 1;
                puVar22 = (unpacked_uastc_block *)((long)puVar22 + ((ulong)bVar36 * -2 + 1) * 4);
              }
              *total_refined = *total_refined + 1;
            }
          }
          memcpy(&local_430,&local_240,0x98);
          bVar3 = basist::unpack_uastc(&local_430,(color32 *)&local_358[0].field_0,false);
          if (!bVar3) goto LAB_00259d1c;
          puVar22 = &local_430;
          paVar24 = &local_2d8.m_astc;
          for (lVar8 = 0x1a; lVar8 != 0; lVar8 = lVar8 + -1) {
            paVar24->m_weight_range = (puVar22->m_astc).m_weight_range;
            puVar22 = (unpacked_uastc_block *)((long)puVar22 + (ulong)bVar36 * -8 + 4);
            paVar24 = (astc_block_desc *)((long)paVar24 + ((ulong)bVar36 * -2 + 1) * 4);
          }
          local_2d8.m_solid_color.field_0 =
               (anon_union_4_2_6eba8969_for_color_rgba_0)local_430.m_solid_color.field_0;
          local_2d8.m_astc_err = 0;
          base_search_rad = 0xffffffff;
          switch(local_4ec) {
          case 0:
            num_pixels = 0;
            local_539 = false;
            local_53a = false;
            base_search_rad = 0x2904;
            goto LAB_00259b38;
          case 1:
            base_search_rad = 0x2904;
            num_pixels = 0;
            break;
          case 2:
            base_search_rad = 0x2dc5;
            num_pixels = 1;
            break;
          case 3:
            num_pixels = 2;
            break;
          default:
            num_pixels = 3;
          }
          local_539 = false;
          local_53a = false;
          paVar29 = local_358;
          compute_bc1_hints(&local_539,&local_53a,&local_2d8,(color_rgba (*) [4])local_4c8,
                            (color_rgba (*) [4])paVar29);
          mul_search_rad = (uint32_t)paVar29;
LAB_00259b38:
          if ((local_430.m_mode == 8) || (basist::g_uastc_mode_has_alpha[local_430.m_mode] == '\0'))
          {
            local_460[0] = (eac_a8_block)0x0;
          }
          else {
            uVar35 = 0;
            do {
              local_398.m_bytes[uVar35] =
                   local_358[(uVar35 >> 2 & 0x3fffffff) * 4 + (ulong)((uint)uVar35 & 3)].field_0.a;
              uVar35 = uVar35 + 1;
            } while (uVar35 != 0x10);
            local_528.m_dwords[2] = 0;
            local_528.m_dwords[0] = 0;
            local_528.m_dwords[1] = 0;
            uastc_pack_eac_a8((uastc_pack_eac_a8_results *)&local_528,local_398.m_bytes,num_pixels,
                              base_search_rad,mul_search_rad,table_mask);
            local_460[0]._0_2_ =
                 (ushort)(local_528.m_dwords[2] << 0xc) |
                 (ushort)((local_528.m_dwords[1] & 0xf) << 8);
          }
          local_528.m_dwords[0] = 0;
          compute_etc1_hints((etc_block *)&local_398,(uint32_t *)local_528.m_bytes,&local_2d8,
                             (color_rgba (*) [4])local_4c8,(color_rgba (*) [4])local_358,local_4ec,
                             local_4b0);
          pack_uastc((uastc_block *)&local_498,&local_2d8,(etc_block *)&local_398,
                     local_528.m_dwords[0],local_460,local_539,local_53a);
          *(undefined8 *)local_4d8 = local_498._0_8_;
          *(undefined8 *)(local_4d8->m_bytes + 8) = local_498._8_8_;
        }
        uVar35 = local_510;
        local_430.m_astc._0_8_ = 0;
        uVar5 = 0;
        uVar25 = local_538 & 0xffffffff;
        do {
          uVar12 = (uint)uVar25 & 7;
          iVar16 = 8 - uVar12;
          if ((int)(uVar4 - uVar5) < iVar16) {
            iVar16 = uVar4 - uVar5;
          }
          local_430.m_astc._0_8_ =
               local_430.m_astc._0_8_ |
               (ulong)(~(-1 << ((byte)iVar16 & 0x1f)) &
                      (uint)(local_498.m_bytes[uVar25 >> 3] >> (sbyte)uVar12)) <<
               ((byte)uVar5 & 0x3f);
          uVar5 = uVar5 + iVar16;
          uVar25 = (ulong)((uint)uVar25 + iVar16);
        } while (uVar5 < uVar4);
        local_430.m_astc.m_partition_seed = (int)local_538;
        iVar16 = (int)local_510;
        local_430.m_astc.m_ccs = iVar16;
        pVar49 = std::
                 _Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                 ::_M_emplace<std::pair<basisu::selector_bitsequence,unsigned_int>>
                           ((_Hashtable<basisu::selector_bitsequence,std::pair<basisu::selector_bitsequence_const,unsigned_int>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<basisu::selector_bitsequence>,basisu::selector_bitsequence_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                             *)&local_310,&local_430);
        pBlock_pixels = pcVar2;
        if (((undefined1  [16])pVar49 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          *(int *)((long)pVar49.first.
                         super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                         ._M_cur.
                         super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                  + 0x18) = iVar16;
        }
      }
LAB_00259cfb:
      uVar35 = uVar35 + 1;
      local_470 = local_470 + 0x10;
      uVar10 = CONCAT71(pVar49.first.
                        super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
                        ._M_cur._1_7_,local_438 <= uVar35);
    } while (uVar35 != local_438);
  }
  bVar36 = 1;
LAB_00259d21:
  std::
  _Hashtable<basisu::selector_bitsequence,_std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<basisu::selector_bitsequence>,_basisu::selector_bitsequence_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_310);
  return (bool)(bVar36 & 1);
}

Assistant:

static bool uastc_rdo_blocks(uint32_t first_index, uint32_t last_index, basist::uastc_block* pBlocks, const color_rgba* pBlock_pixels, const uastc_rdo_params& params, uint32_t flags, 
		uint32_t &total_skipped, uint32_t &total_refined, uint32_t &total_modified, uint32_t &total_smooth)
	{
		debug_printf("uastc_rdo_blocks: Processing blocks %u to %u\n", first_index, last_index);

		const int total_blocks_to_check = basisu::maximum<uint32_t>(1U, params.m_lz_dict_size / sizeof(basist::uastc_block));
		const bool perceptual = false;

		std::unordered_map<selector_bitsequence, uint32_t, selector_bitsequence_hash> selector_history;
						
		for (uint32_t block_index = first_index; block_index < last_index; block_index++)
		{
			const basist::uastc_block& blk = pBlocks[block_index];
			const color_rgba* pPixels = &pBlock_pixels[16 * block_index];

			unpacked_uastc_block unpacked_blk;
			if (!unpack_uastc(blk, unpacked_blk, false, true))
				return false;

			const uint32_t block_mode = unpacked_blk.m_mode;
			if (block_mode == UASTC_MODE_INDEX_SOLID_COLOR)
				continue;

			tracked_stat r_stats, g_stats, b_stats, a_stats;

			for (uint32_t i = 0; i < 16; i++)
			{
				r_stats.update(pPixels[i].r);
				g_stats.update(pPixels[i].g);
				b_stats.update(pPixels[i].b);
				a_stats.update(pPixels[i].a);
			}

			const float max_std_dev = basisu::maximum<float>(basisu::maximum<float>(basisu::maximum(r_stats.get_std_dev(), g_stats.get_std_dev()), b_stats.get_std_dev()), a_stats.get_std_dev());

			float yl = clamp<float>(max_std_dev / params.m_max_smooth_block_std_dev, 0.0f, 1.0f);
			yl = yl * yl;
			const float smooth_block_error_scale = lerp<float>(params.m_smooth_block_max_error_scale, 1.0f, yl);
			if (smooth_block_error_scale > 1.0f)
				total_smooth++;

			color_rgba decoded_uastc_block[4][4];
			if (!unpack_uastc(unpacked_blk, (basist::color32*)decoded_uastc_block, false))
				return false;

			uint64_t uastc_err = 0;
			for (uint32_t i = 0; i < 16; i++)
				uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_uastc_block)[i], true);

			// Transcode to BC7
			bc7_optimization_results b7_results;
			if (!transcode_uastc_to_bc7(unpacked_blk, b7_results))
				return false;

			basist::bc7_block b7_block;
			basist::encode_bc7_block(&b7_block, &b7_results);

			color_rgba decoded_b7_blk[4][4];
			unpack_block(texture_format::cBC7, &b7_block, &decoded_b7_blk[0][0]);
						
			uint64_t bc7_err = 0;
			for (uint32_t i = 0; i < 16; i++)
				bc7_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_b7_blk)[i], true);

			uint64_t cur_err = (uastc_err + bc7_err) / 2;

			// Divide by 16*4 to compute RMS error
			const float cur_ms_err = (float)cur_err * (1.0f / 64.0f);
			const float cur_rms_err = sqrt(cur_ms_err);

			const uint32_t first_sel_bit = g_uastc_mode_selector_bits[block_mode][0];
			const uint32_t total_sel_bits = g_uastc_mode_selector_bits[block_mode][1];
			assert(first_sel_bit + total_sel_bits <= 128);
			assert(total_sel_bits > 0);

			uint32_t cur_bit_offset = first_sel_bit;
			uint64_t cur_sel_bits = read_bits((const uint8_t*)&blk, cur_bit_offset, basisu::minimum(64U, total_sel_bits));

			if (cur_rms_err >= params.m_skip_block_rms_thresh)
			{
				auto cur_search_res = selector_history.insert(std::make_pair(selector_bitsequence(first_sel_bit, cur_sel_bits), block_index));

				// Block already has too much error, so don't mess with it.
				if (!cur_search_res.second)
					(*cur_search_res.first).second = block_index;

				total_skipped++;
				continue;
			}

			int cur_bits;
			auto cur_find_res = selector_history.find(selector_bitsequence(first_sel_bit, cur_sel_bits));
			if (cur_find_res == selector_history.end())
			{
				// Wasn't found - wildly estimate literal cost
				//cur_bits = (total_sel_bits * 5) / 4;
				cur_bits = (total_sel_bits * params.m_lz_literal_cost) / 100;
			}
			else
			{
				// Was found - wildly estimate match cost
				uint32_t match_block_index = cur_find_res->second;
				const int block_dist_in_bytes = (block_index - match_block_index) * 16;
				cur_bits = compute_match_cost_estimate(block_dist_in_bytes);
			}

			int first_block_to_check = basisu::maximum<int>(first_index, block_index - total_blocks_to_check);
			int last_block_to_check = block_index - 1;

			basist::uastc_block best_block(blk);
			uint32_t best_block_index = block_index;

			float best_t = cur_ms_err * smooth_block_error_scale + cur_bits * params.m_lambda;

			// Now scan through previous blocks, insert their selector bit patterns into the current block, and find 
			// selector bit patterns which don't increase the overall block error too much.
			for (int prev_block_index = last_block_to_check; prev_block_index >= first_block_to_check; --prev_block_index)
			{
				const basist::uastc_block& prev_blk = pBlocks[prev_block_index];

				uint32_t bit_offset = first_sel_bit;
				uint64_t sel_bits = read_bits((const uint8_t*)&prev_blk, bit_offset, basisu::minimum(64U, total_sel_bits));

				int match_block_index = prev_block_index;
				auto res = selector_history.find(selector_bitsequence(first_sel_bit, sel_bits));
				if (res != selector_history.end())
					match_block_index = res->second;
				// Have we already checked this bit pattern? If so then skip this block.
				if (match_block_index > prev_block_index)
					continue;

				unpacked_uastc_block unpacked_prev_blk;
				if (!unpack_uastc(prev_blk, unpacked_prev_blk, false, true))
					return false;

				basist::uastc_block trial_blk(blk);

				set_block_bits((uint8_t*)&trial_blk, sel_bits, basisu::minimum(64U, total_sel_bits), first_sel_bit);

				if (total_sel_bits > 64)
				{
					sel_bits = read_bits((const uint8_t*)&prev_blk, bit_offset, total_sel_bits - 64U);

					set_block_bits((uint8_t*)&trial_blk, sel_bits, total_sel_bits - 64U, first_sel_bit + basisu::minimum(64U, total_sel_bits));
				}

				unpacked_uastc_block unpacked_trial_blk;
				if (!unpack_uastc(trial_blk, unpacked_trial_blk, false, true))
					continue;

				color_rgba decoded_trial_uastc_block[4][4];
				if (!unpack_uastc(unpacked_trial_blk, (basist::color32*)decoded_trial_uastc_block, false))
					continue;

				uint64_t trial_uastc_err = 0;
				for (uint32_t i = 0; i < 16; i++)
					trial_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_uastc_block)[i], true);

				// Transcode trial to BC7, compute error
				bc7_optimization_results trial_b7_results;
				if (!transcode_uastc_to_bc7(unpacked_trial_blk, trial_b7_results))
					return false;

				basist::bc7_block trial_b7_block;
				basist::encode_bc7_block(&trial_b7_block, &trial_b7_results);

				color_rgba decoded_trial_b7_blk[4][4];
				unpack_block(texture_format::cBC7, &trial_b7_block, &decoded_trial_b7_blk[0][0]);

				uint64_t trial_bc7_err = 0;
				for (uint32_t i = 0; i < 16; i++)
					trial_bc7_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_b7_blk)[i], true);

				uint64_t trial_err = (trial_uastc_err + trial_bc7_err) / 2;

				const float trial_ms_err = (float)trial_err * (1.0f / 64.0f);
				const float trial_rms_err = sqrtf(trial_ms_err);

				if (trial_rms_err > cur_rms_err * params.m_max_allowed_rms_increase_ratio)
					continue;

				const int block_dist_in_bytes = (block_index - match_block_index) * 16;
				const int match_bits = compute_match_cost_estimate(block_dist_in_bytes);

				float t = trial_ms_err * smooth_block_error_scale + match_bits * params.m_lambda;
				if (t < best_t)
				{
					best_t = t;
					best_block_index = prev_block_index;

					best_block = trial_blk;
				}

			} // prev_block_index

			if (best_block_index != block_index)
			{
				total_modified++;

				unpacked_uastc_block unpacked_best_blk;
				if (!unpack_uastc(best_block, unpacked_best_blk, false, false))
					return false;

				if ((params.m_endpoint_refinement) && (block_mode == 0))
				{
					// Attempt to refine mode 0 block's endpoints, using the new selectors. This doesn't help much, but it does help.
					// TODO: We could do this with the other modes too.
					color_rgba decoded_best_uastc_block[4][4];
					if (!unpack_uastc(unpacked_best_blk, (basist::color32*)decoded_best_uastc_block, false))
						return false;

					// Compute the block's current error (with the modified selectors).
					uint64_t best_uastc_err = 0;
					for (uint32_t i = 0; i < 16; i++)
						best_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_best_uastc_block)[i], true);

					bc7enc_compress_block_params comp_params;
					memset(&comp_params, 0, sizeof(comp_params));
					comp_params.m_max_partitions_mode1 = 64;
					comp_params.m_least_squares_passes = 1;
					comp_params.m_weights[0] = 1;
					comp_params.m_weights[1] = 1;
					comp_params.m_weights[2] = 1;
					comp_params.m_weights[3] = 1;
					comp_params.m_uber_level = 0;

					uastc_encode_results results;
					uint32_t total_results = 0;
					astc_mode0_or_18(0, (color_rgba(*)[4])pPixels, &results, total_results, comp_params, unpacked_best_blk.m_astc.m_weights);
					assert(total_results == 1);

					// See if the overall error has actually gone done.

					color_rgba decoded_trial_uastc_block[4][4];
					bool success = unpack_uastc(results.m_uastc_mode, results.m_common_pattern, results.m_solid_color.get_color32(), results.m_astc, (basist::color32*) & decoded_trial_uastc_block[0][0], false);
					assert(success);
					
					BASISU_NOTE_UNUSED(success);

					uint64_t trial_uastc_err = 0;
					for (uint32_t i = 0; i < 16; i++)
						trial_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_uastc_block)[i], true);

					if (trial_uastc_err < best_uastc_err)
					{
						// The error went down, so accept the new endpoints.

						// Ensure the selectors haven't changed, otherwise we'll invalidate the LZ matches.
						for (uint32_t i = 0; i < 16; i++)
							assert(unpacked_best_blk.m_astc.m_weights[i] == results.m_astc.m_weights[i]);

						unpacked_best_blk.m_astc = results.m_astc;

						total_refined++;
					}
				} // if ((params.m_endpoint_refinement) && (block_mode == 0))

				// The selectors have changed, so go recompute the block hints.
				if (!uastc_recompute_hints(&best_block, pPixels, flags, &unpacked_best_blk))
					return false;

				// Write the modified block
				pBlocks[block_index] = best_block;
			
			} // if (best_block_index != block_index)

			{
				uint32_t bit_offset = first_sel_bit;
				uint64_t sel_bits = read_bits((const uint8_t*)&best_block, bit_offset, basisu::minimum(64U, total_sel_bits));

				auto res = selector_history.insert(std::make_pair(selector_bitsequence(first_sel_bit, sel_bits), block_index));
				if (!res.second)
					(*res.first).second = block_index;
			}

		} // block_index

		return true;
	}